

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

Availability __thiscall
miniscript::Node<CPubKey>::Satisfy<(anonymous_namespace)::Satisfier>
          (Node<CPubKey> *this,Satisfier *ctx,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *stack,bool nonmalleable)

{
  uint uVar1;
  Node<CPubKey> *node;
  ulong uVar2;
  pointer psVar3;
  undefined1 uVar4;
  void *pvVar5;
  byte bVar6;
  ulong uVar7;
  byte bVar8;
  Availability AVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Span<miniscript::internal::InputResult> subres;
  vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack_1;
  anon_class_8_1_ba1d3d87 local_190;
  vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  local_188;
  void *local_168;
  void *pvStack_160;
  long local_158;
  InputResult local_148;
  _Storage<miniscript::internal::InputResult,_false> local_f8;
  undefined1 local_a8;
  undefined1 local_98 [56];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_60;
  bool local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_158 = 0;
  local_168 = (void *)0x0;
  pvStack_160 = (void *)0x0;
  local_188.
  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ._M_impl.super__Vector_impl_data._M_finish = (InputResult *)0x0;
  local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
  local_190.ctx = ctx;
  std::
  vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2})const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::No...State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#1})const::StackElem>>
  ::
  emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState>
            ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::No___State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_1_)const::StackElem>>
              *)&local_168,this,(int *)local_98,(bool *)0x0);
  if (pvStack_160 != local_168) {
    uVar4 = local_a8;
    do {
      pvVar5 = pvStack_160;
      node = *(Node<CPubKey> **)((long)pvStack_160 + -0x18);
      uVar2 = *(ulong *)((long)pvStack_160 + -0x10);
      psVar3 = (node->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(node->subs).
                    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4;
      local_a8 = uVar4;
      if (uVar2 < uVar7) {
        *(bool **)((long)pvStack_160 + -0x10) = (bool *)(uVar2 + 1);
        local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
        std::
        vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2})const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::No...State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#1})const::StackElem>>
        ::
        emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState>
                  ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::No___State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_1_)const::StackElem>>
                    *)&local_168,
                   psVar3[uVar2].
                   super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(int *)local_98,(bool *)(uVar2 + 1));
        bVar10 = false;
      }
      else {
        if ((ulong)(((long)local_188.
                           super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_188.
                           super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333) <
            uVar7) {
          __assert_fail("results.size() >= node.subs.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x273,
                        "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = miniscript::internal::InputResult, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                       );
        }
        subres.m_size =
             (long)(node->subs).
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(node->subs).
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
        subres.m_data =
             (InputResult *)
             ((long)local_188.
                    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             subres.m_size * -0x50 +
             ((long)local_188.
                    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_188.
                   super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                   ._M_impl.super__Vector_impl_data._M_start));
        anon_func::anon_class_8_1_ba1d3d87::operator()(&local_148,&local_190,node,subres);
        uVar1 = (node->typ).m_flags;
        bVar6 = (byte)uVar1;
        if (((local_148.nsat.available != NO & bVar6 >> 4) == 1) &&
           (local_148.nsat.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_148.nsat.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)) {
          __assert_fail("ret.nsat.stack.size() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x55b,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((local_148.sat.available != NO & bVar6 >> 4) == 1) &&
           (local_148.sat.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_148.sat.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)) {
          __assert_fail("ret.sat.stack.size() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x55c,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((bVar6 >> 5 & local_148.nsat.available != NO) == 1) &&
           ((long)local_148.nsat.stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_148.nsat.stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x18)) {
          __assert_fail("ret.nsat.stack.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x55f,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((local_148.sat.available != NO & bVar6 >> 5) == 1) &&
           ((long)local_148.sat.stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_148.sat.stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x18)) {
          __assert_fail("ret.sat.stack.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x560,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        bVar8 = bVar6 >> 6 & local_148.sat.available != NO;
        if ((bVar8 == 1) &&
           (local_148.sat.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_148.sat.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)) {
          __assert_fail("ret.sat.stack.size() >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x564,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((local_148.nsat.available != NO & bVar6 >> 6) == 1) &&
           (local_148.nsat.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_148.nsat.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)) {
          __assert_fail("ret.nsat.stack.size() >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x565,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((bVar8 != 0) &&
           (local_148.sat.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_148.sat.stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
          __assert_fail("!ret.sat.stack.back().empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x566,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (local_148.nsat.available == NO && (char)bVar6 < '\0') {
          __assert_fail("ret.nsat.available != Availability::NO",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x56a,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((char)bVar6 < '\0' & local_148.nsat.has_sig) == 1) {
          __assert_fail("!ret.nsat.has_sig",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x56b,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((((char)bVar6 < '\0') && ((local_148.nsat.malleable & 1U) == 0)) &&
           ((local_148.nsat.non_canon & 1U) != 0)) {
          __assert_fail("!ret.nsat.non_canon",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x56c,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((local_148.nsat.available != NO && (local_148.nsat.has_sig & 1U) == 0) &&
            (uVar1 >> 10 & 1) != 0) {
          __assert_fail("ret.nsat.has_sig",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x56f,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((((byte)(uVar1 >> 0xb) & local_148.sat.available != NO) == 1) &&
           (local_148.sat.has_sig == false)) {
          __assert_fail("ret.sat.has_sig",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x570,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((uVar1 & 0x1200) == 0x1200 && local_148.nsat.available == NO) {
          __assert_fail("ret.nsat.available != Availability::NO",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x573,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((uVar1 & 0x1200) == 0x1200 & local_148.nsat.malleable) == 1) {
          __assert_fail("!ret.nsat.malleable",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x574,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if ((byte)(local_148.sat.available != NO & local_148.sat.malleable & (byte)(uVar1 >> 0xc))
            == 1) {
          __assert_fail("!ret.sat.malleable",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x577,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        if (((local_148.sat.available != NO) && ((local_148.sat.malleable & 1U) == 0)) &&
           ((local_148.sat.non_canon & 1U) != 0)) {
          __assert_fail("!ret.sat.non_canon",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x57a,
                        "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                       );
        }
        local_98._0_8_ =
             CONCAT17(local_148.nsat._7_1_,
                      CONCAT16(local_148.nsat.non_canon,
                               CONCAT15(local_148.nsat.malleable,
                                        CONCAT14(local_148.nsat.has_sig,local_148.nsat.available))))
        ;
        local_98._8_8_ = local_148.nsat.size;
        local_98._16_8_ =
             local_148.nsat.stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_98._24_8_ =
             local_148.nsat.stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_98._32_8_ =
             local_148.nsat.stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_148.nsat.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_148.nsat.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.nsat.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98._48_8_ = local_148.sat.size;
        local_60.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_148.sat.stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_60.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_148.sat.stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_60.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_148.sat.stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_148.sat.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_148.sat.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.sat.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48 = true;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector(&local_148.sat.stack);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector(&local_148.nsat.stack);
        bVar10 = local_48 == false;
        if (bVar10) {
          uVar4 = 0;
        }
        else {
          std::
          vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
          ::_M_erase(&local_188,
                     local_188.
                     super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish +
                     -((ulong)((long)(node->subs).
                                     super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(node->subs).
                                    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4),
                     (iterator)
                     local_188.
                     super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::
          vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
          ::emplace_back<miniscript::internal::InputResult>(&local_188,(InputResult *)local_98);
          pvStack_160 = (void *)((long)pvVar5 + -0x18);
        }
        std::_Optional_payload_base<miniscript::internal::InputResult>::_M_reset
                  ((_Optional_payload_base<miniscript::internal::InputResult> *)local_98);
        local_a8 = uVar4;
      }
      if (bVar10) goto LAB_00483424;
      uVar4 = local_a8;
    } while (pvStack_160 != local_168);
  }
  if ((long)local_188.
            super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_188.
            super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x50) {
    __assert_fail("results.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x27e,
                  "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = miniscript::internal::InputResult, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                 );
  }
  local_f8._0_8_ =
       *(undefined8 *)
        &(local_188.
          super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
          ._M_impl.super__Vector_impl_data._M_start)->nsat;
  local_f8._M_value.nsat.size =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->nsat).size;
  local_f8._M_value.nsat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_f8._M_value.nsat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_f8._M_value.nsat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_188.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_188.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_188.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->nsat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._40_4_ =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->sat).available;
  local_f8._44_1_ =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->sat).has_sig;
  local_f8._45_1_ =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->sat).malleable;
  local_f8._46_1_ =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->sat).non_canon;
  local_f8._47_1_ =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->sat).field_0x7;
  local_f8._M_value.sat.size =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->sat).size;
  local_f8._M_value.sat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_f8._M_value.sat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_f8._M_value.sat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       ((local_188.
         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_188.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_188.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_188.
    super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
    ._M_impl.super__Vector_impl_data._M_start)->sat).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = 1;
LAB_00483424:
  std::vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ::~vector(&local_188);
  if (local_168 != (void *)0x0) {
    operator_delete(local_168,local_158 - (long)local_168);
  }
  local_98._0_8_ = local_f8._0_8_;
  local_98._8_8_ = local_f8._M_value.nsat.size;
  local_98._16_8_ =
       local_f8._M_value.nsat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98._24_8_ =
       local_f8._M_value.nsat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98._32_8_ =
       local_f8._M_value.nsat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f8._M_value.nsat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_value.nsat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_value.nsat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._40_8_ = local_f8._40_8_;
  local_98._48_8_ = local_f8._M_value.sat.size;
  local_60.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_f8._M_value.sat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_60.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_f8._M_value.sat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_60.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8._M_value.sat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f8._M_value.sat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_value.sat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_value.sat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Optional_payload_base<miniscript::internal::InputResult>::_M_reset
            ((_Optional_payload_base<miniscript::internal::InputResult> *)&local_f8._M_value);
  if ((!nonmalleable) ||
     ((AVar9 = NO, (bool)local_98[0x2d] == false && ((bool)local_98[0x2c] == true)))) {
    local_f8._0_8_ =
         (stack->
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_f8._M_value.nsat.size =
         (size_t)(stack->
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    local_f8._M_value.nsat.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (stack->
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (stack->
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_60.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (stack->
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_60.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (stack->
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_60.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_60.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&local_f8._M_value);
    AVar9 = local_98._40_4_;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)(local_98 + 0x10));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return AVar9;
}

Assistant:

Availability Satisfy(const Ctx& ctx, std::vector<std::vector<unsigned char>>& stack, bool nonmalleable = true) const {
        auto ret = ProduceInput(ctx);
        if (nonmalleable && (ret.sat.malleable || !ret.sat.has_sig)) return Availability::NO;
        stack = std::move(ret.sat.stack);
        return ret.sat.available;
    }